

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

attr_list ContactWriter(SstStream Stream,char *Filename,SstParams Params,SMPI_Comm comm,
                       CMConnection *conn_p,void **WriterFileID_p)

{
  uint uVar1;
  bool bVar2;
  CPNetworkInfoFunc p_Var3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *__stream;
  ushort **ppuVar7;
  char *pcVar8;
  CMConnection p_Var9;
  attr_list p_Var10;
  long lVar11;
  SMPI_Comm comm_00;
  long lVar12;
  uint local_2888;
  int local_2884;
  CMConnection *local_2880;
  void **local_2878;
  SstStream local_2870;
  undefined1 local_2868 [47];
  char local_2839;
  stat Buf;
  
  local_2884 = 0;
  if (Stream->Rank == 0) {
    if (Stream->RegistrationMethod == SstRegisterScreen) {
      local_2880 = conn_p;
      fprintf(_stdout,
              "Please enter the contact information associated with SST input stream \"%s\":\n",
              Filename);
      pcVar8 = fgets((char *)&Buf,0x2800,_stdin);
      if (pcVar8 == (char *)0x0) {
        fwrite("Read from stdin failed, exiting\n",0x20,1,_stdout);
        exit(1);
      }
      ppuVar7 = __ctype_b_loc();
      pcVar8 = &local_2839;
      do {
        pcVar5 = pcVar8 + 1;
        pcVar8 = pcVar8 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
      pcVar8 = strdup(pcVar8);
LAB_006ba4d0:
      if (pcVar8 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar6 = strlen(pcVar8);
        pcVar5 = (char *)malloc(sVar6 + 1);
        __isoc99_sscanf(pcVar8,"%p:%s",WriterFileID_p);
        free(pcVar8);
        p_Var3 = globalNetinfoCallback;
        if (globalNetinfoCallback != (CPNetworkInfoFunc)0x0) {
          pcVar8 = CP_GetContactString(Stream,(attr_list)0x0);
          (*p_Var3)(1,pcVar8,IPDiagString);
          (*globalNetinfoCallback)(2,pcVar5,(char *)0x0);
        }
        p_Var10 = (attr_list)attr_list_from_string(pcVar5);
        p_Var9 = Tunneling_get_conn(Stream->CPInfo->SharedCM->cm,p_Var10);
        free_attr_list(p_Var10);
        if (p_Var9 != (CMConnection)0x0) {
          sVar6 = strlen(pcVar5);
          local_2884 = (int)sVar6 + 1;
          conn_p = local_2880;
          goto LAB_006ba596;
        }
      }
      local_2884 = 0;
      p_Var9 = (CMConnection)0x0;
      conn_p = local_2880;
    }
    else {
      if (Stream->RegistrationMethod == SstRegisterFile) {
        uVar1 = Params->OpenTimeoutSecs;
        local_2880 = conn_p;
        local_2878 = WriterFileID_p;
        sVar6 = strlen(Filename);
        pcVar5 = (char *)malloc(sVar6 + 5);
        snprintf(pcVar5,sVar6 + 5,"%s.sst",Filename);
        local_2870 = Stream;
        CP_verbose(Stream,PerRankVerbose,
                   "Looking for writer contact in file %s, with timeout %d secs\n",pcVar5,
                   (ulong)uVar1);
        lVar11 = 5000;
        local_2888 = 0;
        lVar12 = (long)(int)uVar1 * 1000;
        do {
          while (__stream = fopen(pcVar5,"r"), __stream != (FILE *)0x0) {
            iVar4 = fileno(__stream);
            fstat(iVar4,(stat *)&Buf);
            Stream = local_2870;
            WriterFileID_p = local_2878;
            if (((uint)Buf.st_size != 0) || (3 < local_2888)) {
              if ((uint)Buf.st_size < 0xf) {
LAB_006ba6ac:
                pcVar8 = (char *)0x0;
                fprintf(_stderr,"!!! File %s is not an ADIOS2 SST Engine Contact file\n",pcVar5);
                free(pcVar5);
              }
              else {
                sVar6 = fread(local_2868,0xf,1,__stream);
                if (sVar6 != 1) {
                  fwrite("Filesystem read failed in SST Open, failing operation\n",0x36,1,_stderr);
                  fclose(__stream);
                }
                iVar4 = bcmp(local_2868,"#ADIOS2-SST v0\n",0xf);
                if ((sVar6 != 1) || (iVar4 != 0)) goto LAB_006ba6ac;
                free(pcVar5);
                pcVar8 = (char *)calloc(1,(Buf.st_size << 0x20) + -0xe00000000 >> 0x20);
                sVar6 = fread(pcVar8,(Buf.st_size << 0x20) + -0xf00000000 >> 0x20,1,__stream);
                if (sVar6 != 1) {
                  fwrite("Filesystem read failed in SST Open, failing operation\n",0x36,1,_stderr);
                  free(pcVar8);
                  fclose(__stream);
                  pcVar8 = (char *)0x0;
                  goto LAB_006ba4d0;
                }
              }
              fclose(__stream);
              goto LAB_006ba4d0;
            }
            local_2888 = local_2888 + 1;
            usleep(100000);
          }
          usleep(100000);
          if (lVar11 == 100) {
            fprintf(_stderr,
                    "ADIOS2 SST Engine waiting for contact information file %s to be created\n",
                    Filename);
          }
          lVar11 = lVar11 + -100;
          bVar2 = 100 < lVar12;
          lVar12 = lVar12 + -100;
        } while (bVar2);
        free(pcVar5);
        pcVar8 = (char *)0x0;
        Stream = local_2870;
        WriterFileID_p = local_2878;
        goto LAB_006ba4d0;
      }
      pcVar5 = (char *)0x0;
      local_2884 = 0;
      p_Var9 = (CMConnection)0x0;
    }
LAB_006ba596:
    *conn_p = p_Var9;
    p_Var10 = (attr_list)0x0;
    SMPI_Bcast(&local_2884,1,SMPI_INT,0,Stream->mpiComm);
    if (local_2884 == 0) goto LAB_006ba5da;
    comm_00 = Stream->mpiComm;
    iVar4 = local_2884;
  }
  else {
    SMPI_Bcast(&local_2884,1,SMPI_INT,0,Stream->mpiComm);
    iVar4 = local_2884;
    if ((long)local_2884 == 0) {
      return (attr_list)0x0;
    }
    pcVar5 = (char *)malloc((long)local_2884);
    comm_00 = Stream->mpiComm;
  }
  SMPI_Bcast(pcVar5,iVar4,SMPI_CHAR,0,comm_00);
  p_Var10 = (attr_list)attr_list_from_string(pcVar5);
LAB_006ba5da:
  free(pcVar5);
  return p_Var10;
}

Assistant:

attr_list ContactWriter(SstStream Stream, char *Filename, SstParams Params, SMPI_Comm comm,
                        CMConnection *conn_p, void **WriterFileID_p)
{
    int DataSize = 0;
    attr_list RetVal = NULL;

    if (Stream->Rank == 0)
    {
        char *Writer0Contact = readContactInfo(Filename, Stream, Params->OpenTimeoutSecs);
        char *CMContactString = NULL;
        CMConnection conn = NULL;
        attr_list WriterRank0Contact;

        if (Writer0Contact)
        {

            CMContactString = malloc(strlen(Writer0Contact) + 1); /* +1 for null terminator */
            sscanf(Writer0Contact, "%p:%s", WriterFileID_p, CMContactString);
            //        printf("Writer contact info is fileID %p, contact info
            //        %s\n",
            //               WriterFileID, CMContactString);
            free(Writer0Contact);

            if (globalNetinfoCallback)
            {
                (globalNetinfoCallback)(1, CP_GetContactString(Stream, NULL), IPDiagString);
                (globalNetinfoCallback)(2, CMContactString, NULL);
            }
            WriterRank0Contact = attr_list_from_string(CMContactString);
            conn = Tunneling_get_conn(Stream->CPInfo->SharedCM->cm, WriterRank0Contact);
            free_attr_list(WriterRank0Contact);
        }
        if (conn)
        {
            DataSize = (int)strlen(CMContactString) + 1;
            *conn_p = conn;
        }
        else
        {
            DataSize = 0;
            *conn_p = NULL;
        }
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            SMPI_Bcast(CMContactString, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(CMContactString);
        }
        if (CMContactString)
            free(CMContactString);
    }
    else
    {
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            char *Buffer = malloc(DataSize);
            SMPI_Bcast(Buffer, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(Buffer);
            free(Buffer);
        }
    }
    return RetVal;
}